

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall cmComputeTargetDepends::Compute(cmComputeTargetDepends *this)

{
  bool bVar1;
  cmComputeComponentGraph ccg;
  allocator<char> local_109;
  string local_108;
  cmComputeComponentGraph local_e8;
  
  CollectTargets(this);
  CollectDepends(this);
  if (this->DebugMode == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"initial",(allocator<char> *)&local_108);
    DisplayGraph(this,&this->InitialGraph,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  cmComputeComponentGraph::cmComputeComponentGraph(&local_e8,&this->InitialGraph);
  if (this->DebugMode == true) {
    DisplayComponents(this,&local_e8);
  }
  bVar1 = CheckComponents(this,&local_e8);
  if (bVar1) {
    bVar1 = ComputeFinalDepends(this,&local_e8);
    if (bVar1) {
      bVar1 = true;
      if (this->DebugMode == true) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"final",&local_109);
        DisplayGraph(this,&this->FinalGraph,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
      }
      goto LAB_00265de5;
    }
  }
  bVar1 = false;
LAB_00265de5:
  cmComputeComponentGraph::~cmComputeComponentGraph(&local_e8);
  return bVar1;
}

Assistant:

bool cmComputeTargetDepends::Compute()
{
  // Build the original graph.
  this->CollectTargets();
  this->CollectDepends();
  if (this->DebugMode) {
    this->DisplayGraph(this->InitialGraph, "initial");
  }

  // Identify components.
  cmComputeComponentGraph ccg(this->InitialGraph);
  if (this->DebugMode) {
    this->DisplayComponents(ccg);
  }
  if (!this->CheckComponents(ccg)) {
    return false;
  }

  // Compute the final dependency graph.
  if (!this->ComputeFinalDepends(ccg)) {
    return false;
  }
  if (this->DebugMode) {
    this->DisplayGraph(this->FinalGraph, "final");
  }

  return true;
}